

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  wchar_t wVar1;
  long lVar2;
  byte *pbVar3;
  byte *result;
  FILE *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char mode_ascii [4];
  char local_3c [4];
  byte *local_38;
  
  if (path == (wchar_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1399,
                  "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
  }
  lVar7 = -4;
  do {
    lVar6 = lVar7 + 4;
    lVar7 = lVar7 + 4;
  } while (*(int *)((long)path + lVar6) != 0);
  if (lVar7 == 0) {
    lVar6 = 0;
  }
  else {
    lVar2 = 0;
    lVar6 = 0;
    do {
      wVar1 = path[lVar2];
      lVar5 = 4;
      if (((uint)wVar1 < 0x10000) && (lVar5 = 1, 0x7f < (uint)wVar1)) {
        lVar5 = 3 - (ulong)((uint)wVar1 < 0x800);
      }
      lVar6 = lVar6 + lVar5;
      lVar2 = lVar2 + 1;
    } while (lVar7 >> 2 != lVar2);
  }
  pbVar3 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(lVar6 + 1);
  if (pbVar3 == (byte *)0x0) {
    pbVar3 = (byte *)0x0;
  }
  else {
    result = pbVar3;
    local_38 = pbVar3;
    if (lVar7 != 0) {
      lVar2 = 0;
      do {
        wVar1 = path[lVar2];
        if ((uint)wVar1 < 0x10000) {
          result = utf8_writer::low(result,wVar1);
        }
        else {
          *result = (byte)((uint)wVar1 >> 0x12) | 0xf0;
          result[1] = (byte)((uint)wVar1 >> 0xc) & 0x3f | 0x80;
          result[2] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
          result[3] = (byte)wVar1 & 0x3f | 0x80;
          result = result + 4;
        }
        lVar2 = lVar2 + 1;
      } while (lVar7 >> 2 != lVar2);
    }
    if (pbVar3 + lVar6 != result) {
      __assert_fail("begin + size == end",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x905,
                    "void pugi::impl::(anonymous namespace)::as_utf8_end(char *, size_t, const wchar_t *, size_t)"
                   );
    }
    pbVar3[lVar6] = 0;
    pbVar3 = local_38;
  }
  if (pbVar3 == (byte *)0x0) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    local_3c[0] = '\0';
    local_3c[1] = '\0';
    local_3c[2] = '\0';
    local_3c[3] = '\0';
    wVar1 = *mode;
    if (wVar1 != L'\0') {
      lVar7 = 0;
      do {
        local_3c[lVar7] = (char)wVar1;
        wVar1 = mode[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (wVar1 != L'\0');
    }
    pFVar4 = fopen((char *)pbVar3,local_3c);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (pbVar3);
  }
  return (FILE *)pFVar4;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}